

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O1

void libdef_func(BuildCtx *ctx,char *p,int arg)

{
  char **ppcVar1;
  uint8_t *puVar2;
  int iVar3;
  int extraout_EAX;
  int iVar4;
  size_t sVar5;
  char cVar6;
  char *pcVar7;
  ulong uVar8;
  FILE *pFVar9;
  long lVar10;
  uint local_3c;
  
  uVar8 = (ulong)(uint)arg;
  if (arg != 0) {
    ffasmfunc = ffasmfunc + 1;
  }
  switch(ctx->mode) {
  case BUILD_ffdef:
    pFVar9 = (FILE *)ctx->fp;
    pcVar7 = "FFDEF(%s)\n";
    break;
  case BUILD_libdef:
    if (modstate != 0) {
      iVar4 = modstate;
      if (regfunc == 1) {
        if (optr + 1 < (uint8_t *)((long)&optr + 1U)) {
          puVar2 = optr + 1;
          *optr = 0xfe;
          optr = puVar2;
          goto LAB_0010ae1c;
        }
        goto LAB_0010afa2;
      }
      goto LAB_0010aef5;
    }
    goto LAB_0010af9a;
  case BUILD_recdef:
    sVar5 = strlen(p);
    if (sVar5 < 0x50) {
      strcpy(funcname,p);
      goto LAB_0010ae1c;
    }
    libdef_func_cold_1();
LAB_0010af9a:
    libdef_func_cold_3();
LAB_0010afa2:
    libdef_func_cold_2();
  case BUILD_vmdef:
    cVar6 = p[1];
    if (cVar6 != '\0') {
      lVar10 = 0;
      do {
        if (modname[lVar10] == '\0') break;
        if (cVar6 == '_') {
          p[lVar10 + 1] = '.';
        }
        cVar6 = p[lVar10 + 2];
        lVar10 = lVar10 + 1;
      } while (cVar6 != '\0');
    }
    pFVar9 = (FILE *)ctx->fp;
    pcVar7 = "\"%s\",\n";
    break;
  default:
    if (ctx->mode != BUILD_bcdef || arg == 0) goto LAB_0010ae1c;
    iVar4 = ctx->nglob;
    if (0 < (long)iVar4) {
      pFVar9 = (FILE *)ctx->fp;
      ppcVar1 = ctx->globnames;
      lVar10 = 0;
      do {
        pcVar7 = ppcVar1[lVar10];
        uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
        if ((((*pcVar7 == 'f') && (pcVar7[1] == 'f')) && (pcVar7[2] == '_')) &&
           (iVar3 = strcmp(pcVar7 + 3,p), iVar3 == 0)) {
          local_3c = *(int *)(ctx->glob + lVar10) - *(int *)&ctx->code;
          uVar8 = 0;
        }
        arg = (int)uVar8;
        if ((char)uVar8 == '\0') {
          fprintf(pFVar9,",\n%d",(ulong)local_3c);
          goto LAB_0010ae1c;
        }
        lVar10 = lVar10 + 1;
      } while (iVar4 != lVar10);
    }
    libdef_func_cold_4();
    iVar4 = extraout_EAX;
LAB_0010aef5:
    if (arg != 0x80) {
      if (iVar4 != 1) {
        fwrite(",\n",2,1,(FILE *)ctx->fp);
      }
      modstate = 2;
      pcVar7 = "lj_cf_";
      if (arg != 0) {
        pcVar7 = "lj_ffh_";
      }
      fprintf((FILE *)ctx->fp,"  %s%s",pcVar7,p);
    }
    if (regfunc == 2) {
      p = "";
    }
    else {
      obuf[2] = obuf[2] + '\x01';
    }
    libdef_name(p,arg);
    goto LAB_0010ae1c;
  }
  fprintf(pFVar9,pcVar7,p);
LAB_0010ae1c:
  ffid = ffid + 1;
  regfunc = 0;
  return;
}

Assistant:

static void libdef_func(BuildCtx *ctx, char *p, int arg)
{
  if (arg != LIBINIT_CF)
    ffasmfunc++;
  if (ctx->mode == BUILD_libdef) {
    if (modstate == 0) {
      fprintf(stderr, "Error: no module for function definition %s\n", p);
      exit(1);
    }
    if (regfunc == REGFUNC_NOREG) {
      if (optr+1 > obuf+sizeof(obuf)) {
	fprintf(stderr, "Error: output buffer overflow\n");
	exit(1);
      }
      *optr++ = LIBINIT_FFID;
    } else {
      if (arg != LIBINIT_ASM_) {
	if (modstate != 1) fprintf(ctx->fp, ",\n");
	modstate = 2;
	fprintf(ctx->fp, "  %s%s", arg ? LABEL_PREFIX_FFH : LABEL_PREFIX_CF, p);
      }
      if (regfunc != REGFUNC_NOREGUV) obuf[2]++;  /* Bump hash table size. */
      libdef_name(regfunc == REGFUNC_NOREGUV ? "" : p, arg);
    }
  } else if (ctx->mode == BUILD_ffdef) {
    fprintf(ctx->fp, "FFDEF(%s)\n", p);
  } else if (ctx->mode == BUILD_recdef) {
    if (strlen(p) > sizeof(funcname)-1) {
      fprintf(stderr, "Error: function name too long: '%s'\n", p);
      exit(1);
    }
    strcpy(funcname, p);
  } else if (ctx->mode == BUILD_vmdef) {
    int i;
    for (i = 1; p[i] && modname[i-1]; i++)
      if (p[i] == '_') p[i] = '.';
    fprintf(ctx->fp, "\"%s\",\n", p);
  } else if (ctx->mode == BUILD_bcdef) {
    if (arg != LIBINIT_CF)
      fprintf(ctx->fp, ",\n%d", find_ffofs(ctx, p));
  }
  ffid++;
  regfunc = REGFUNC_OK;
}